

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint64_t helper_neon_widen_s8_arm(uint32_t x)

{
  return CONCAT44((uint)(int)(short)(x >> 8) >> 8,
                  ((int)(short)x & 0xffff00U) << 8 | (int)(char)x & 0xffffU) & 0xffffffffffff |
         (ulong)(uint)((int)x >> 0x18) << 0x30;
}

Assistant:

uint64_t HELPER(neon_widen_s8)(uint32_t x)
{
    uint64_t tmp;
    uint64_t ret;
    ret = (uint16_t)(int8_t)x;
    tmp = (uint16_t)(int8_t)(x >> 8);
    ret |= tmp << 16;
    tmp = (uint16_t)(int8_t)(x >> 16);
    ret |= tmp << 32;
    tmp = (uint16_t)(int8_t)(x >> 24);
    ret |= tmp << 48;
    return ret;
}